

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createHairyPlane
          (SceneGraph *this,int hash,Vec3fa *pos,Vec3fa *dx,Vec3fa *dy,float len,float r,
          size_t numHairs,CurveSubtype subtype,Ref<embree::SceneGraph::MaterialNode> *material)

{
  pointer *ppHVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  iterator iVar4;
  size_t sVar5;
  pointer pvVar6;
  ulong uVar7;
  Vec3fx *pVVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 uVar11;
  ulong uVar12;
  uint uVar13;
  HairSetNode *this_00;
  Vec3fx *pVVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  Node *pNVar18;
  size_t i;
  size_t sVar19;
  float in_XMM0_Db;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float in_XMM1_Db;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar28;
  float fVar29;
  Hair local_f0;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  size_t local_b0;
  Ref<embree::SceneGraph::MaterialNode> local_a8;
  Node *local_a0;
  Vec3fa *local_98;
  Vec3fa *local_90;
  Vec3fa *local_88;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_e8 = r;
  fStack_e4 = in_XMM1_Db;
  fStack_e0 = in_XMM1_Dc;
  fStack_dc = in_XMM1_Dd;
  local_c8 = len;
  fStack_c4 = in_XMM0_Db;
  fStack_c0 = in_XMM0_Dc;
  fStack_bc = in_XMM0_Dd;
  local_b0 = numHairs;
  local_98 = dx;
  local_90 = pos;
  local_88 = dy;
  this_00 = (HairSetNode *)operator_new(0x118);
  local_a8 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  if (local_a8.ptr != (MaterialNode *)0x0) {
    (*((local_a8.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  HairSetNode::HairSetNode
            (this_00,RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE - (subtype == ROUND_CURVE),&local_a8,
             (BBox1f)0x3f80000000000000,1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  local_a0 = (Node *)this;
  if (local_a8.ptr != (MaterialNode *)0x0) {
    (*((local_a8.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  if (local_b0 != 0) {
    if (local_b0 == 1) {
      local_d8 = (local_90->field_0).m128[0];
      fStack_d4 = (local_90->field_0).m128[1];
      fStack_d0 = (local_90->field_0).m128[2];
      fStack_cc = (local_90->field_0).m128[3];
      local_f0.vertex = 0;
      local_f0.id = 0;
      iVar4._M_current =
           (this_00->hairs).
           super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this_00->hairs).
          super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
        ::_M_realloc_insert<embree::SceneGraph::HairSetNode::Hair>(&this_00->hairs,iVar4,&local_f0);
      }
      else {
        (iVar4._M_current)->vertex = 0;
        (iVar4._M_current)->id = 0;
        ppHVar1 = &(this_00->hairs).
                   super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppHVar1 = *ppHVar1 + 1;
      }
      pvVar6 = (this_00->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar19 = pvVar6->size_active;
      uVar7 = pvVar6->size_alloced;
      uVar16 = sVar19 + 1;
      uVar17 = uVar7;
      if ((uVar7 < uVar16) && (uVar17 = uVar16, uVar12 = uVar7, uVar7 != 0)) {
        for (; uVar17 = uVar12, uVar12 < uVar16; uVar12 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0)) {
        }
      }
      if (uVar7 != uVar17) {
        pVVar8 = pvVar6->items;
        pVVar14 = (Vec3fx *)alignedMalloc(uVar17 << 4,0x10);
        pvVar6->items = pVVar14;
        if (pvVar6->size_active != 0) {
          lVar15 = 0;
          uVar16 = 0;
          do {
            puVar2 = (undefined8 *)((long)&pVVar8->field_0 + lVar15);
            uVar11 = puVar2[1];
            puVar3 = (undefined8 *)((long)&pvVar6->items->field_0 + lVar15);
            *puVar3 = *puVar2;
            puVar3[1] = uVar11;
            uVar16 = uVar16 + 1;
            lVar15 = lVar15 + 0x10;
          } while (uVar16 < pvVar6->size_active);
        }
        alignedFree(pVVar8);
        pvVar6->size_active = sVar19;
        pvVar6->size_alloced = uVar17;
      }
      sVar19 = pvVar6->size_active;
      pvVar6->size_active = sVar19 + 1;
      pVVar8 = pvVar6->items + sVar19;
      (pVVar8->field_0).m128[0] = local_d8;
      (pVVar8->field_0).m128[1] = fStack_d4;
      (pVVar8->field_0).m128[2] = fStack_d0;
      (pVVar8->field_0).m128[3] = local_e8;
      pvVar6 = (this_00->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar19 = pvVar6->size_active;
      uVar7 = pvVar6->size_alloced;
      uVar16 = sVar19 + 1;
      uVar17 = uVar7;
      if ((uVar7 < uVar16) && (uVar17 = uVar16, uVar12 = uVar7, uVar7 != 0)) {
        for (; uVar17 = uVar12, uVar12 < uVar16; uVar12 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0)) {
        }
      }
      if (uVar7 != uVar17) {
        pVVar8 = pvVar6->items;
        pVVar14 = (Vec3fx *)alignedMalloc(uVar17 << 4,0x10);
        pvVar6->items = pVVar14;
        if (pvVar6->size_active != 0) {
          lVar15 = 0;
          uVar16 = 0;
          do {
            puVar2 = (undefined8 *)((long)&pVVar8->field_0 + lVar15);
            uVar11 = puVar2[1];
            puVar3 = (undefined8 *)((long)&pvVar6->items->field_0 + lVar15);
            *puVar3 = *puVar2;
            puVar3[1] = uVar11;
            uVar16 = uVar16 + 1;
            lVar15 = lVar15 + 0x10;
          } while (uVar16 < pvVar6->size_active);
        }
        alignedFree(pVVar8);
        pvVar6->size_active = sVar19;
        pvVar6->size_alloced = uVar17;
      }
      fStack_c4 = local_c8;
      fStack_c0 = local_c8;
      fStack_bc = local_c8;
      fStack_e4 = local_e8;
      fStack_e0 = local_e8;
      fStack_dc = local_e8;
      sVar19 = pvVar6->size_active;
      pvVar6->size_active = sVar19 + 1;
      pVVar8 = pvVar6->items + sVar19;
      (pVVar8->field_0).m128[0] = local_c8 * 1.0 + local_d8;
      (pVVar8->field_0).m128[1] = local_c8 * 0.0 + fStack_d4;
      (pVVar8->field_0).m128[2] = local_c8 * 0.0 + fStack_d0;
      (pVVar8->field_0).m128[3] = local_e8;
      pvVar6 = (this_00->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar19 = pvVar6->size_active;
      uVar7 = pvVar6->size_alloced;
      uVar16 = sVar19 + 1;
      uVar17 = uVar7;
      if ((uVar7 < uVar16) && (uVar17 = uVar16, uVar12 = uVar7, uVar7 != 0)) {
        for (; uVar17 = uVar12, uVar12 < uVar16; uVar12 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0)) {
        }
      }
      if (uVar7 != uVar17) {
        pVVar8 = pvVar6->items;
        pVVar14 = (Vec3fx *)alignedMalloc(uVar17 << 4,0x10);
        pvVar6->items = pVVar14;
        if (pvVar6->size_active != 0) {
          lVar15 = 0;
          uVar16 = 0;
          do {
            puVar2 = (undefined8 *)((long)&pVVar8->field_0 + lVar15);
            uVar11 = puVar2[1];
            puVar3 = (undefined8 *)((long)&pvVar6->items->field_0 + lVar15);
            *puVar3 = *puVar2;
            puVar3[1] = uVar11;
            uVar16 = uVar16 + 1;
            lVar15 = lVar15 + 0x10;
          } while (uVar16 < pvVar6->size_active);
        }
        alignedFree(pVVar8);
        pvVar6->size_active = sVar19;
        pvVar6->size_alloced = uVar17;
      }
      sVar19 = pvVar6->size_active;
      pvVar6->size_active = sVar19 + 1;
      pVVar8 = pvVar6->items + sVar19;
      (pVVar8->field_0).m128[0] = local_c8 * 0.0 + local_d8;
      (pVVar8->field_0).m128[1] = fStack_c4 * 1.0 + fStack_d4;
      (pVVar8->field_0).m128[2] = fStack_c0 * 1.0 + fStack_d0;
      (pVVar8->field_0).m128[3] = fStack_dc;
      pvVar6 = (this_00->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar19 = pvVar6->size_active;
      uVar7 = pvVar6->size_alloced;
      uVar16 = sVar19 + 1;
      uVar17 = uVar7;
      if ((uVar7 < uVar16) && (uVar17 = uVar16, uVar12 = uVar7, uVar7 != 0)) {
        for (; uVar17 = uVar12, uVar12 < uVar16; uVar12 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0)) {
        }
      }
      if (uVar7 != uVar17) {
        pVVar8 = pvVar6->items;
        pVVar14 = (Vec3fx *)alignedMalloc(uVar17 << 4,0x10);
        pvVar6->items = pVVar14;
        if (pvVar6->size_active != 0) {
          lVar15 = 0;
          uVar16 = 0;
          do {
            puVar2 = (undefined8 *)((long)&pVVar8->field_0 + lVar15);
            uVar11 = puVar2[1];
            puVar3 = (undefined8 *)((long)&pvVar6->items->field_0 + lVar15);
            *puVar3 = *puVar2;
            puVar3[1] = uVar11;
            uVar16 = uVar16 + 1;
            lVar15 = lVar15 + 0x10;
          } while (uVar16 < pvVar6->size_active);
        }
        alignedFree(pVVar8);
        pvVar6->size_active = sVar19;
        pvVar6->size_alloced = uVar17;
      }
      pNVar18 = local_a0;
      sVar19 = pvVar6->size_active;
      pvVar6->size_active = sVar19 + 1;
      pVVar8 = pvVar6->items + sVar19;
      (pVVar8->field_0).m128[0] = local_c8 * 0.0 + local_d8;
      (pVVar8->field_0).m128[1] = fStack_c4 * 1.0 + fStack_d4;
      (pVVar8->field_0).m128[2] = fStack_c0 * 0.0 + fStack_d0;
      (pVVar8->field_0).m128[3] = fStack_dc;
      (local_a0->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
      (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
      goto LAB_0017614e;
    }
    uVar13 = (uint)(hash * -0x3361d2af) >> 0x11 | hash * 0x16a88000;
    uVar13 = (uVar13 * -0x194da000 | uVar13 * 0x1b873593 >> 0x13) * 5 + 0xe6546b64;
    uVar13 = (uVar13 >> 0x10 ^ uVar13) * -0x7a143595;
    uVar13 = (uVar13 >> 0xd ^ uVar13) * -0x3d4d51cb;
    uVar13 = uVar13 >> 0x10 ^ uVar13;
    fStack_50 = (local_88->field_0).m128[1] * (local_98->field_0).m128[0] -
                (local_98->field_0).m128[1] * (local_88->field_0).m128[0];
    local_58 = (local_88->field_0).m128[2] * (local_98->field_0).m128[1] -
               (local_98->field_0).m128[2] * (local_88->field_0).m128[1];
    fStack_54 = (local_88->field_0).m128[0] * (local_98->field_0).m128[2] -
                (local_98->field_0).m128[0] * (local_88->field_0).m128[2];
    fVar26 = (local_88->field_0).m128[3] * (local_98->field_0).m128[3] -
             (local_98->field_0).m128[3] * (local_88->field_0).m128[3];
    fVar24 = local_58 * local_58;
    fVar25 = fStack_54 * fStack_54;
    fVar27 = fVar26 * fVar26;
    fVar28 = fVar25 + fVar24 + fStack_50 * fStack_50;
    fVar29 = fVar27 + fVar24 + fVar24;
    fVar25 = fVar25 + fVar24 + fVar25;
    fVar27 = fVar27 + fVar24 + fVar27;
    auVar22._4_4_ = fVar29;
    auVar22._0_4_ = fVar28;
    auVar22._8_4_ = fVar25;
    auVar22._12_4_ = fVar27;
    auVar23._4_4_ = fVar29;
    auVar23._0_4_ = fVar28;
    auVar23._8_4_ = fVar25;
    auVar23._12_4_ = fVar27;
    auVar23 = rsqrtss(auVar22,auVar23);
    fVar24 = auVar23._0_4_;
    fStack_4c = fVar24 * fVar24 * fVar28 * -0.5 * fVar24 + fVar24 * 1.5;
    local_58 = fStack_4c * local_58;
    fStack_54 = fStack_4c * fStack_54;
    fStack_50 = fStack_4c * fStack_50;
    fStack_4c = fStack_4c * fVar26;
    fStack_c4 = local_c8;
    fStack_c0 = local_c8;
    fStack_bc = local_c8;
    local_68 = local_c8 * local_58;
    fStack_64 = local_c8 * fStack_54;
    fStack_60 = local_c8 * fStack_50;
    fStack_5c = local_c8 * fStack_4c;
    local_80 = &this_00->hairs;
    fStack_e4 = local_e8;
    fStack_e0 = local_e8;
    fStack_dc = local_e8;
    sVar19 = 0;
    do {
      fVar24 = (float)(uVar13 * 0x19660d + 0x3c6ef35f >> 1) * 4.656613e-10;
      local_48 = (local_98->field_0).m128[0];
      fStack_44 = (local_98->field_0).m128[1];
      fStack_40 = (local_98->field_0).m128[2];
      fStack_3c = (local_98->field_0).m128[3];
      local_d8 = fVar24 * local_48 + (local_90->field_0).m128[0];
      fStack_d4 = fVar24 * fStack_44 + (local_90->field_0).m128[1];
      fStack_d0 = fVar24 * fStack_40 + (local_90->field_0).m128[2];
      fStack_cc = fVar24 * fStack_3c + (local_90->field_0).m128[3];
      local_78 = *(undefined8 *)&local_88->field_0;
      uStack_70 = *(undefined8 *)((long)&local_88->field_0 + 8);
      local_f0.id = (uint)sVar19;
      local_f0.vertex = (uint)sVar19 * 4;
      iVar4._M_current =
           (this_00->hairs).
           super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this_00->hairs).
          super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
        ::_M_realloc_insert<embree::SceneGraph::HairSetNode::Hair>(local_80,iVar4,&local_f0);
      }
      else {
        *iVar4._M_current = local_f0;
        ppHVar1 = &(this_00->hairs).
                   super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppHVar1 = *ppHVar1 + 1;
      }
      pvVar6 = (this_00->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar5 = pvVar6->size_active;
      uVar7 = pvVar6->size_alloced;
      uVar16 = sVar5 + 1;
      uVar17 = uVar7;
      if ((uVar7 < uVar16) && (uVar17 = uVar16, uVar12 = uVar7, uVar7 != 0)) {
        for (; uVar17 = uVar12, uVar12 < uVar16; uVar12 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0)) {
        }
      }
      if (uVar7 != uVar17) {
        pVVar8 = pvVar6->items;
        pVVar14 = (Vec3fx *)alignedMalloc(uVar17 << 4,0x10);
        pvVar6->items = pVVar14;
        if (pvVar6->size_active != 0) {
          lVar15 = 0;
          uVar16 = 0;
          do {
            puVar2 = (undefined8 *)((long)&pVVar8->field_0 + lVar15);
            uVar11 = puVar2[1];
            puVar3 = (undefined8 *)((long)&pvVar6->items->field_0 + lVar15);
            *puVar3 = *puVar2;
            puVar3[1] = uVar11;
            uVar16 = uVar16 + 1;
            lVar15 = lVar15 + 0x10;
          } while (uVar16 < pvVar6->size_active);
        }
        alignedFree(pVVar8);
        pvVar6->size_active = sVar5;
        pvVar6->size_alloced = uVar17;
      }
      uVar13 = uVar13 * 0x17385ca9 + 0x47502932;
      fVar24 = (float)(uVar13 >> 1) * 4.656613e-10;
      local_d8 = local_d8 + fVar24 * (float)local_78;
      fStack_d4 = fStack_d4 + fVar24 * local_78._4_4_;
      fStack_d0 = fStack_d0 + fVar24 * (float)uStack_70;
      fStack_cc = fStack_cc + fVar24 * uStack_70._4_4_;
      sVar5 = pvVar6->size_active;
      pvVar6->size_active = sVar5 + 1;
      pVVar8 = pvVar6->items + sVar5;
      (pVVar8->field_0).m128[0] = local_d8;
      (pVVar8->field_0).m128[1] = fStack_d4;
      (pVVar8->field_0).m128[2] = fStack_d0;
      (pVVar8->field_0).m128[3] = fStack_dc;
      pvVar6 = (this_00->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar5 = pvVar6->size_active;
      uVar7 = pvVar6->size_alloced;
      uVar16 = sVar5 + 1;
      uVar17 = uVar7;
      if ((uVar7 < uVar16) && (uVar17 = uVar16, uVar12 = uVar7, uVar7 != 0)) {
        for (; uVar17 = uVar12, uVar12 < uVar16; uVar12 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0)) {
        }
      }
      if (uVar7 != uVar17) {
        pVVar8 = pvVar6->items;
        pVVar14 = (Vec3fx *)alignedMalloc(uVar17 << 4,0x10);
        pvVar6->items = pVVar14;
        if (pvVar6->size_active != 0) {
          lVar15 = 0;
          uVar16 = 0;
          do {
            puVar2 = (undefined8 *)((long)&pVVar8->field_0 + lVar15);
            uVar11 = puVar2[1];
            puVar3 = (undefined8 *)((long)&pvVar6->items->field_0 + lVar15);
            *puVar3 = *puVar2;
            puVar3[1] = uVar11;
            uVar16 = uVar16 + 1;
            lVar15 = lVar15 + 0x10;
          } while (uVar16 < pvVar6->size_active);
        }
        alignedFree(pVVar8);
        pvVar6->size_active = sVar5;
        pvVar6->size_alloced = uVar17;
      }
      fVar24 = fStack_44 * fStack_44;
      fVar25 = fStack_40 * fStack_40;
      fVar26 = fStack_3c * fStack_3c;
      fVar27 = fVar24 + local_48 * local_48 + fVar25;
      fVar28 = fVar24 + fVar24 + fVar26;
      fVar25 = fVar24 + fVar25 + fVar25;
      fVar26 = fVar24 + fVar26 + fVar26;
      auVar20._4_4_ = fVar28;
      auVar20._0_4_ = fVar27;
      auVar20._8_4_ = fVar25;
      auVar20._12_4_ = fVar26;
      auVar9._4_4_ = fVar28;
      auVar9._0_4_ = fVar27;
      auVar9._8_4_ = fVar25;
      auVar9._12_4_ = fVar26;
      auVar23 = rsqrtss(auVar20,auVar9);
      fVar24 = auVar23._0_4_;
      fVar24 = fVar24 * 1.5 - fVar24 * fVar24 * fVar27 * 0.5 * fVar24;
      sVar5 = pvVar6->size_active;
      pvVar6->size_active = sVar5 + 1;
      pVVar8 = pvVar6->items + sVar5;
      (pVVar8->field_0).m128[0] = fVar24 * local_48 * local_c8 + local_d8;
      (pVVar8->field_0).m128[1] = fVar24 * fStack_44 * fStack_c4 + fStack_d4;
      (pVVar8->field_0).m128[2] = fVar24 * fStack_40 * fStack_c0 + fStack_d0;
      (pVVar8->field_0).m128[3] = fStack_dc;
      pvVar6 = (this_00->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar5 = pvVar6->size_active;
      uVar7 = pvVar6->size_alloced;
      uVar16 = sVar5 + 1;
      uVar17 = uVar7;
      if ((uVar7 < uVar16) && (uVar17 = uVar16, uVar12 = uVar7, uVar7 != 0)) {
        for (; uVar17 = uVar12, uVar12 < uVar16; uVar12 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0)) {
        }
      }
      if (uVar7 != uVar17) {
        pVVar8 = pvVar6->items;
        pVVar14 = (Vec3fx *)alignedMalloc(uVar17 << 4,0x10);
        pvVar6->items = pVVar14;
        if (pvVar6->size_active != 0) {
          lVar15 = 0;
          uVar16 = 0;
          do {
            puVar2 = (undefined8 *)((long)&pVVar8->field_0 + lVar15);
            uVar11 = puVar2[1];
            puVar3 = (undefined8 *)((long)&pvVar6->items->field_0 + lVar15);
            *puVar3 = *puVar2;
            puVar3[1] = uVar11;
            uVar16 = uVar16 + 1;
            lVar15 = lVar15 + 0x10;
          } while (uVar16 < pvVar6->size_active);
        }
        alignedFree(pVVar8);
        pvVar6->size_active = sVar5;
        pvVar6->size_alloced = uVar17;
      }
      fVar24 = local_78._4_4_ * local_78._4_4_;
      fVar25 = (float)uStack_70 * (float)uStack_70;
      fVar26 = uStack_70._4_4_ * uStack_70._4_4_;
      fVar27 = fVar24 + (float)local_78 * (float)local_78 + fVar25;
      fVar28 = fVar24 + fVar24 + fVar26;
      fVar25 = fVar24 + fVar25 + fVar25;
      fVar26 = fVar24 + fVar26 + fVar26;
      auVar21._4_4_ = fVar28;
      auVar21._0_4_ = fVar27;
      auVar21._8_4_ = fVar25;
      auVar21._12_4_ = fVar26;
      auVar10._4_4_ = fVar28;
      auVar10._0_4_ = fVar27;
      auVar10._8_4_ = fVar25;
      auVar10._12_4_ = fVar26;
      auVar23 = rsqrtss(auVar21,auVar10);
      fVar24 = auVar23._0_4_;
      fVar24 = fVar24 * 1.5 - fVar24 * fVar24 * fVar27 * 0.5 * fVar24;
      sVar5 = pvVar6->size_active;
      pvVar6->size_active = sVar5 + 1;
      pVVar8 = pvVar6->items + sVar5;
      (pVVar8->field_0).m128[0] = (fVar24 * (float)local_78 + local_58) * local_c8 + local_d8;
      (pVVar8->field_0).m128[1] = (fVar24 * local_78._4_4_ + fStack_54) * fStack_c4 + fStack_d4;
      (pVVar8->field_0).m128[2] = (fVar24 * (float)uStack_70 + fStack_50) * fStack_c0 + fStack_d0;
      (pVVar8->field_0).m128[3] = fStack_dc;
      pvVar6 = (this_00->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar5 = pvVar6->size_active;
      uVar7 = pvVar6->size_alloced;
      uVar16 = sVar5 + 1;
      uVar17 = uVar7;
      if ((uVar7 < uVar16) && (uVar17 = uVar16, uVar12 = uVar7, uVar7 != 0)) {
        for (; uVar17 = uVar12, uVar12 < uVar16; uVar12 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0)) {
        }
      }
      if (uVar7 != uVar17) {
        pVVar8 = pvVar6->items;
        pVVar14 = (Vec3fx *)alignedMalloc(uVar17 << 4,0x10);
        pvVar6->items = pVVar14;
        if (pvVar6->size_active != 0) {
          lVar15 = 0;
          uVar16 = 0;
          do {
            puVar2 = (undefined8 *)((long)&pVVar8->field_0 + lVar15);
            uVar11 = puVar2[1];
            puVar3 = (undefined8 *)((long)&pvVar6->items->field_0 + lVar15);
            *puVar3 = *puVar2;
            puVar3[1] = uVar11;
            uVar16 = uVar16 + 1;
            lVar15 = lVar15 + 0x10;
          } while (uVar16 < pvVar6->size_active);
        }
        alignedFree(pVVar8);
        pvVar6->size_active = sVar5;
        pvVar6->size_alloced = uVar17;
      }
      sVar5 = pvVar6->size_active;
      pvVar6->size_active = sVar5 + 1;
      pVVar8 = pvVar6->items + sVar5;
      (pVVar8->field_0).m128[0] = local_d8 + local_68;
      (pVVar8->field_0).m128[1] = fStack_d4 + fStack_64;
      (pVVar8->field_0).m128[2] = fStack_d0 + fStack_60;
      (pVVar8->field_0).m128[3] = fStack_dc;
      sVar19 = sVar19 + 1;
    } while (sVar19 != local_b0);
  }
  pNVar18 = local_a0;
  (local_a0->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
LAB_0017614e:
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)pNVar18;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createHairyPlane (int hash, const Vec3fa& pos, const Vec3fa& dx, const Vec3fa& dy, const float len, const float r, size_t numHairs, CurveSubtype subtype, Ref<MaterialNode> material)
  {
    RandomSampler sampler;
    RandomSampler_init(sampler,hash);

    RTCGeometryType type = (subtype == ROUND_CURVE) ? RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE : RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE;
    Ref<SceneGraph::HairSetNode> mesh = new SceneGraph::HairSetNode(type,material,BBox1f(0,1),1);

    if (numHairs == 1) {
      const Vec3fa p0 = pos;
      const Vec3fa p1 = p0 + len*Vec3fa(1,0,0);
      const Vec3fa p2 = p0 + len*Vec3fa(0,1,1);
      const Vec3fa p3 = p0 + len*Vec3fa(0,1,0);
      mesh->hairs.push_back(HairSetNode::Hair(0,0));
      mesh->positions[0].push_back(Vec3ff(p0,r));
      mesh->positions[0].push_back(Vec3ff(p1,r));
      mesh->positions[0].push_back(Vec3ff(p2,r));
      mesh->positions[0].push_back(Vec3ff(p3,r));
      return mesh.dynamicCast<SceneGraph::Node>();
    }

    Vec3fa dz = cross(dx,dy);
    for (size_t i=0; i<numHairs; i++) 
    {
      const Vec3fa p0 = pos + RandomSampler_getFloat(sampler)*dx + RandomSampler_getFloat(sampler)*dy;
      const Vec3fa p1 = p0 + len*normalize(dx);
      const Vec3fa p2 = p0 + len*(normalize(dz)+normalize(dy));
      const Vec3fa p3 = p0 + len*normalize(dz);
      mesh->hairs.push_back(HairSetNode::Hair(unsigned(4*i),unsigned(i)));
      mesh->positions[0].push_back(Vec3ff(p0,r));
      mesh->positions[0].push_back(Vec3ff(p1,r));
      mesh->positions[0].push_back(Vec3ff(p2,r));
      mesh->positions[0].push_back(Vec3ff(p3,r));
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }